

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.h
# Opt level: O1

void __thiscall HighsInfo::initRecords(HighsInfo *this)

{
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *this_00;
  pointer *pppIVar1;
  iterator iVar2;
  InfoRecordDouble *pIVar3;
  InfoRecordDouble *local_5b0;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"simplex_iteration_count","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Iteration count for simplex solver","");
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar3,&local_48,&local_68,false,
             &(this->super_HighsInfoStruct).simplex_iteration_count,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  this_00 = &this->records;
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"ipm_iteration_count","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Iteration count for IPM solver","");
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar3,&local_88,&local_a8,false,
             &(this->super_HighsInfoStruct).ipm_iteration_count,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"crossover_iteration_count","");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"Iteration count for crossover","");
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar3,&local_c8,&local_e8,false,
             &(this->super_HighsInfoStruct).crossover_iteration_count,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"pdlp_iteration_count","");
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"Iteration count for PDLP solver","");
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar3,&local_108,&local_128,false,
             &(this->super_HighsInfoStruct).pdlp_iteration_count,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"qp_iteration_count","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,"Iteration count for QP solver","");
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar3,&local_148,&local_168,false,
             &(this->super_HighsInfoStruct).qp_iteration_count,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"primal_solution_status","");
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,
             "Model primal solution status: 0 => No solution; 1 => Infeasible point; 2 => Feasible point"
             ,"");
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar3,&local_188,&local_1a8,false,
             &(this->super_HighsInfoStruct).primal_solution_status,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"dual_solution_status","");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,
             "Model dual solution status: 0 => No solution; 1 => Infeasible point; 2 => Feasible point"
             ,"");
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar3,&local_1c8,&local_1e8,false,
             &(this->super_HighsInfoStruct).dual_solution_status,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"basis_validity","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,"Model basis validity: 0 => Invalid; 1 => Valid","");
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar3,&local_208,&local_228,false,
             &(this->super_HighsInfoStruct).basis_validity,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"objective_function_value","");
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Objective function value","");
  InfoRecordDouble::InfoRecordDouble
            (pIVar3,&local_248,&local_268,false,
             &(this->super_HighsInfoStruct).objective_function_value,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"mip_node_count","");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"MIP solver node count","");
  InfoRecordInt64::InfoRecordInt64
            ((InfoRecordInt64 *)pIVar3,&local_288,&local_2a8,false,
             &(this->super_HighsInfoStruct).mip_node_count,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"mip_dual_bound","");
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"MIP solver dual bound","");
  InfoRecordDouble::InfoRecordDouble
            (pIVar3,&local_2c8,&local_2e8,false,&(this->super_HighsInfoStruct).mip_dual_bound,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"mip_gap","");
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"MIP solver gap (%)","");
  InfoRecordDouble::InfoRecordDouble
            (pIVar3,&local_308,&local_328,false,&(this->super_HighsInfoStruct).mip_gap,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_348,"max_integrality_violation","");
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_368,"Max integrality violation","");
  InfoRecordDouble::InfoRecordDouble
            (pIVar3,&local_348,&local_368,false,
             &(this->super_HighsInfoStruct).max_integrality_violation,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,"num_primal_infeasibilities","");
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"Number of primal infeasibilities","");
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar3,&local_388,&local_3a8,false,
             &(this->super_HighsInfoStruct).num_primal_infeasibilities,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c8,"max_primal_infeasibility","");
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e8,"Maximum primal infeasibility","");
  InfoRecordDouble::InfoRecordDouble
            (pIVar3,&local_3c8,&local_3e8,false,
             &(this->super_HighsInfoStruct).max_primal_infeasibility,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_408,"sum_primal_infeasibilities","");
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_428,"Sum of primal infeasibilities","");
  InfoRecordDouble::InfoRecordDouble
            (pIVar3,&local_408,&local_428,false,
             &(this->super_HighsInfoStruct).sum_primal_infeasibilities,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_448,"num_dual_infeasibilities","");
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_468,"Number of dual infeasibilities","");
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)pIVar3,&local_448,&local_468,false,
             &(this->super_HighsInfoStruct).num_dual_infeasibilities,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"max_dual_infeasibility","");
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,"Maximum dual infeasibility","");
  InfoRecordDouble::InfoRecordDouble
            (pIVar3,&local_488,&local_4a8,false,
             &(this->super_HighsInfoStruct).max_dual_infeasibility,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4c8,"sum_dual_infeasibilities","");
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4e8,"Sum of dual infeasibilities","");
  InfoRecordDouble::InfoRecordDouble
            (pIVar3,&local_4c8,&local_4e8,false,
             &(this->super_HighsInfoStruct).sum_dual_infeasibilities,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_508,"max_complementarity_violation","");
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_528,"Max complementarity violation","");
  InfoRecordDouble::InfoRecordDouble
            (pIVar3,&local_508,&local_528,false,
             &(this->super_HighsInfoStruct).max_complementarity_violation,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_548,"sum_complementarity_violations","");
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_568,"Sum of complementarity violations","");
  InfoRecordDouble::InfoRecordDouble
            (pIVar3,&local_548,&local_568,false,
             &(this->super_HighsInfoStruct).sum_complementarity_violations,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b0 = pIVar3;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pIVar3 = (InfoRecordDouble *)operator_new(0x68);
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"primal_dual_integral","");
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"Primal-dual integral","");
  InfoRecordDouble::InfoRecordDouble
            (pIVar3,&local_588,&local_5a8,false,&(this->super_HighsInfoStruct).primal_dual_integral,
             0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_5b0 = pIVar3;
    std::vector<InfoRecord*,std::allocator<InfoRecord*>>::_M_realloc_insert<InfoRecord*>
              ((vector<InfoRecord*,std::allocator<InfoRecord*>> *)this_00,iVar2,
               (InfoRecord **)&local_5b0);
  }
  else {
    *iVar2._M_current = (InfoRecord *)pIVar3;
    pppIVar1 = &(this->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  return;
}

Assistant:

void initRecords() {
    InfoRecordInt64* record_int64;
    InfoRecordInt* record_int;
    InfoRecordDouble* record_double;
    const bool advanced = false;  // Not used

    record_int = new InfoRecordInt("simplex_iteration_count",
                                   "Iteration count for simplex solver",
                                   advanced, &simplex_iteration_count, 0);
    records.push_back(record_int);

    record_int = new InfoRecordInt("ipm_iteration_count",
                                   "Iteration count for IPM solver", advanced,
                                   &ipm_iteration_count, 0);
    records.push_back(record_int);

    record_int = new InfoRecordInt("crossover_iteration_count",
                                   "Iteration count for crossover", advanced,
                                   &crossover_iteration_count, 0);
    records.push_back(record_int);

    record_int = new InfoRecordInt("pdlp_iteration_count",
                                   "Iteration count for PDLP solver", advanced,
                                   &pdlp_iteration_count, 0);
    records.push_back(record_int);

    record_int =
        new InfoRecordInt("qp_iteration_count", "Iteration count for QP solver",
                          advanced, &qp_iteration_count, 0);
    records.push_back(record_int);

    record_int = new InfoRecordInt("primal_solution_status",
                                   "Model primal solution status: 0 => No "
                                   "solution; 1 => Infeasible point; "
                                   "2 => Feasible point",
                                   advanced, &primal_solution_status,
                                   kSolutionStatusNone);
    records.push_back(record_int);

    record_int =
        new InfoRecordInt("dual_solution_status",
                          "Model dual solution status: 0 => No solution; 1 => "
                          "Infeasible point; 2 "
                          "=> Feasible point",
                          advanced, &dual_solution_status, kSolutionStatusNone);
    records.push_back(record_int);

    record_int = new InfoRecordInt(
        "basis_validity", "Model basis validity: 0 => Invalid; 1 => Valid",
        advanced, &basis_validity, kBasisValidityInvalid);
    records.push_back(record_int);

    record_double = new InfoRecordDouble("objective_function_value",
                                         "Objective function value", advanced,
                                         &objective_function_value, 0);
    records.push_back(record_double);

    record_int64 =
        new InfoRecordInt64("mip_node_count", "MIP solver node count", advanced,
                            &mip_node_count, 0);
    records.push_back(record_int64);

    record_double =
        new InfoRecordDouble("mip_dual_bound", "MIP solver dual bound",
                             advanced, &mip_dual_bound, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble("mip_gap", "MIP solver gap (%)",
                                         advanced, &mip_gap, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble("max_integrality_violation",
                                         "Max integrality violation", advanced,
                                         &max_integrality_violation, 0);
    records.push_back(record_double);

    record_int = new InfoRecordInt("num_primal_infeasibilities",
                                   "Number of primal infeasibilities", advanced,
                                   &num_primal_infeasibilities, -1);
    records.push_back(record_int);

    record_double = new InfoRecordDouble(
        "max_primal_infeasibility", "Maximum primal infeasibility", advanced,
        &max_primal_infeasibility, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble(
        "sum_primal_infeasibilities", "Sum of primal infeasibilities", advanced,
        &sum_primal_infeasibilities, 0);
    records.push_back(record_double);

    record_int = new InfoRecordInt("num_dual_infeasibilities",
                                   "Number of dual infeasibilities", advanced,
                                   &num_dual_infeasibilities, -1);
    records.push_back(record_int);

    record_double = new InfoRecordDouble("max_dual_infeasibility",
                                         "Maximum dual infeasibility", advanced,
                                         &max_dual_infeasibility, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble(
        "sum_dual_infeasibilities", "Sum of dual infeasibilities", advanced,
        &sum_dual_infeasibilities, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble(
        "max_complementarity_violation", "Max complementarity violation",
        advanced, &max_complementarity_violation, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble(
        "sum_complementarity_violations", "Sum of complementarity violations",
        advanced, &sum_complementarity_violations, 0);
    records.push_back(record_double);

    record_double =
        new InfoRecordDouble("primal_dual_integral", "Primal-dual integral",
                             advanced, &primal_dual_integral, 0);
    records.push_back(record_double);
  }